

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O2

void __thiscall
slang::parsing::Preprocessor::applyResetPragma(Preprocessor *this,PragmaDirectiveSyntax *pragma)

{
  size_type sVar1;
  bool bVar2;
  SyntaxNode *this_00;
  SimplePragmaExpressionSyntax *pSVar3;
  Diagnostic *this_01;
  string_view __x;
  SourceRange SVar4;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  const_iterator __begin2;
  
  __begin2.index = 0;
  sVar1 = (pragma->args).elements.size_;
  __begin2.list = &pragma->args;
  do {
    if ((__begin2.list == &pragma->args) && (__begin2.index == sVar1 + 1 >> 1)) {
      return;
    }
    this_00 = &slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
               iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>::operator*(&__begin2)->
               super_SyntaxNode;
    if (this_00->kind == SimplePragmaExpression) {
      pSVar3 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePragmaExpressionSyntax>(this_00);
      if ((pSVar3->value).kind != Identifier) goto LAB_001853a3;
      __x = Token::rawText(&pSVar3->value);
      if (__x._M_len != 0) {
        __y._M_str = "protect";
        __y._M_len = 7;
        bVar2 = std::operator!=(__x,__y);
        if (bVar2) {
          __y_00._M_str = "once";
          __y_00._M_len = 4;
          bVar2 = std::operator!=(__x,__y_00);
          if (bVar2) {
            __y_01._M_str = "diagnostic";
            __y_01._M_len = 10;
            bVar2 = std::operator!=(__x,__y_01);
            if (bVar2) {
              SVar4 = Token::range(&pSVar3->value);
              this_01 = addDiag(this,(DiagCode)0x2b0004,SVar4);
              Diagnostic::operator<<(this_01,__x);
            }
          }
        }
      }
      __y_02._M_str = "protect";
      __y_02._M_len = 7;
      bVar2 = std::operator==(__x,__y_02);
      if (bVar2) {
        this->protectEncryptDepth = 0;
        this->protectDecryptDepth = 0;
        this->protectLineLength = 0;
        this->protectBytes = 0;
        this->protectEncoding = Raw;
      }
    }
    else {
LAB_001853a3:
      SVar4 = slang::syntax::SyntaxNode::sourceRange(this_00);
      addDiag(this,(DiagCode)0x90004,SVar4);
    }
    __begin2.index = __begin2.index + 1;
  } while( true );
}

Assistant:

void Preprocessor::applyResetPragma(const PragmaDirectiveSyntax& pragma) {
    // Just check that we know about the names being reset, and warn if we don't.
    for (auto arg : pragma.args) {
        if (arg->kind == SyntaxKind::SimplePragmaExpression) {
            auto& simple = arg->as<SimplePragmaExpressionSyntax>();
            if (simple.value.kind == TokenKind::Identifier) {
                string_view name = simple.value.rawText();
                if (!name.empty() && name != "protect" && name != "once" && name != "diagnostic")
                    addDiag(diag::UnknownPragma, simple.value.range()) << name;

                if (name == "protect")
                    resetProtectState();

                continue;
            }
        }

        // Otherwise this isn't even a pragma name, so it's ill-formed.
        addDiag(diag::ExpectedPragmaName, arg->sourceRange());
    }
}